

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Namespace * soul::AST::createRootNamespace(Allocator *a)

{
  Identifier this;
  Namespace *pNVar1;
  Context local_58;
  CodeLocation local_38;
  char *local_20;
  Identifier local_18;
  Identifier rootNamespaceName;
  Allocator *a_local;
  
  rootNamespaceName.name = (string *)a;
  local_20 = Program::getRootNamespaceName();
  local_18 = Allocator::get<char_const*>(a,&local_20);
  this = rootNamespaceName;
  local_38.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.data = (char *)0x0;
  CodeLocation::CodeLocation(&local_38);
  local_58.location.sourceCode.object = (SourceCodeText *)0x0;
  local_58.location.location.data = (char *)0x0;
  local_58.parentScope = (Scope *)0x0;
  Context::Context(&local_58);
  pNVar1 = Allocator::
           allocate<soul::AST::Namespace,soul::CodeLocation,soul::AST::Context,soul::Identifier&>
                     ((Allocator *)this.name,&local_38,&local_58,&local_18);
  Context::~Context(&local_58);
  CodeLocation::~CodeLocation(&local_38);
  return pNVar1;
}

Assistant:

static Namespace& createRootNamespace (Allocator& a)
    {
        auto rootNamespaceName = a.get (Program::getRootNamespaceName());
        return a.allocate<Namespace> (CodeLocation(), Context(), rootNamespaceName);
    }